

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::SymbolTable::VarAssign::handle(VarAssign *this,Module *m)

{
  variant<hgdb::json::Variable,unsigned_long> *pvVar1;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *__k;
  const_iterator cVar2;
  mapped_type *__rhs;
  variant<hgdb::json::Variable,_unsigned_long> *variable;
  variant<hgdb::json::Variable,unsigned_long> *this_00;
  
  pvVar1 = (variant<hgdb::json::Variable,unsigned_long> *)
           (m->variables_).
           super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (variant<hgdb::json::Variable,unsigned_long> *)
                 (m->variables_).
                 super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar1;
      this_00 = this_00 + 0x60) {
    if (this_00[0x58] == (variant<hgdb::json::Variable,unsigned_long>)0x0) {
      __k = std::get<0ul,hgdb::json::Variable,unsigned_long>
                      ((variant<hgdb::json::Variable,_unsigned_long> *)this_00);
      cVar2 = std::
              _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this->id_->_M_h,__k);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true>.
          _M_cur != (__node_type *)0x0) {
        __rhs = std::__detail::
                _Map_base<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)this->id_,__k);
        std::variant<hgdb::json::Variable,unsigned_long>::operator=(this_00,__rhs);
      }
    }
  }
  return;
}

Assistant:

void handle(Module *m) override {
            for (auto &variable : m->variables_) {
                auto const &v = variable;
                if (v.index() == 0) {
                    auto const &var = std::get<0>(v);
                    if (id_.find(var) != id_.end()) {
                        variable = id_.at(var);
                    }
                }
            }
        }